

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O1

bool tinyusdz::pathutil::ResolveRelativePath
               (Path *base_prim_path,Path *relative_path,Path *abs_path,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  string remainder;
  string relative_str;
  string abs_dir;
  string base_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_dirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  Path *local_150;
  Path local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Path *local_38;
  
  if (abs_path == (Path *)0x0) {
    return false;
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  pcVar3 = (relative_path->_prim_part)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar3,pcVar3 + (relative_path->_prim_part)._M_string_length);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar3 = (base_prim_path->_prim_part)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (base_prim_path->_prim_part)._M_string_length);
  local_148._prim_part._M_dataplus._M_p = (pointer)&local_148._prim_part.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"/","");
  if (local_78._M_string_length < local_148._prim_part._M_string_length) {
    bVar11 = false;
  }
  else if (local_148._prim_part._M_string_length == 0) {
    bVar11 = true;
  }
  else {
    iVar4 = bcmp(local_148._prim_part._M_dataplus._M_p,local_78._M_dataplus._M_p,
                 local_148._prim_part._M_string_length);
    bVar11 = iVar4 == 0;
  }
  paVar2 = &local_148._prim_part.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._prim_part._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._prim_part._M_dataplus._M_p,
                    CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                      CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                               local_148._prim_part.field_2._M_allocated_capacity.
                                               _0_2_))) + 1);
  }
  if (!bVar11) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar11 = false;
    goto LAB_001ee925;
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
  local_38 = relative_path;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"./","");
  if (local_190._M_string_length < local_148._prim_part._M_string_length) {
    bVar11 = false;
  }
  else if (local_148._prim_part._M_string_length == 0) {
    bVar11 = true;
  }
  else {
    iVar4 = bcmp(local_148._prim_part._M_dataplus._M_p,local_190._M_dataplus._M_p,
                 local_148._prim_part._M_string_length);
    bVar11 = iVar4 == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._prim_part._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._prim_part._M_dataplus._M_p,
                    CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                      CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                               local_148._prim_part.field_2._M_allocated_capacity.
                                               _0_2_))) + 1);
  }
  if (bVar11) {
joined_r0x001ee5e4:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
LAB_001ee90c:
    bVar11 = false;
  }
  else {
    local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"../","");
    if (local_190._M_string_length < local_148._prim_part._M_string_length) {
      bVar11 = false;
    }
    else if (local_148._prim_part._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar4 = bcmp(local_148._prim_part._M_dataplus._M_p,local_190._M_dataplus._M_p,
                   local_148._prim_part._M_string_length);
      bVar11 = iVar4 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                        CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                 local_148._prim_part.field_2._M_allocated_capacity.
                                                 _0_2_))) + 1);
    }
    if (!bVar11) {
      local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,".","");
      if (local_190._M_string_length < local_148._prim_part._M_string_length) {
        bVar11 = false;
      }
      else if (local_148._prim_part._M_string_length == 0) {
        bVar11 = true;
      }
      else {
        iVar4 = bcmp(local_148._prim_part._M_dataplus._M_p,local_190._M_dataplus._M_p,
                     local_148._prim_part._M_string_length);
        bVar11 = iVar4 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
      if (!bVar11) {
        local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"/","");
        if (local_190._M_string_length < local_148._prim_part._M_string_length) {
          bVar11 = false;
        }
        else if (local_148._prim_part._M_string_length == 0) {
          bVar11 = true;
        }
        else {
          iVar4 = bcmp(local_148._prim_part._M_dataplus._M_p,local_190._M_dataplus._M_p,
                       local_148._prim_part._M_string_length);
          bVar11 = iVar4 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._prim_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_148._prim_part._M_dataplus._M_p,
                          CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                            CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                     local_148._prim_part.field_2.
                                                     _M_allocated_capacity._0_2_))) + 1);
        }
        if (bVar11) {
          ::std::__cxx11::string::_M_assign((string *)&local_170);
        }
        else {
          ::std::operator+(&local_1b0,&local_78,"/");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_148,&local_1b0,&local_190);
          ::std::__cxx11::string::operator=((string *)&local_170,(string *)&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
            operator_delete(local_148._prim_part._M_dataplus._M_p,
                            CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                     CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                              CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                       local_148._prim_part.field_2.
                                                       _M_allocated_capacity._0_2_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            local_1d0.field_2._M_allocated_capacity =
                 CONCAT44(local_1b0.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_1b0.field_2._M_local_buf[3],
                                   CONCAT12(local_1b0.field_2._M_local_buf[2],
                                            local_1b0.field_2._M_allocated_capacity._0_2_)));
            _Var8._M_p = local_1b0._M_dataplus._M_p;
            goto LAB_001ee7ef;
          }
        }
        goto LAB_001ee7f7;
      }
      goto joined_r0x001ee5e4;
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_150 = abs_path;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,local_190._M_dataplus._M_p,
               local_190._M_dataplus._M_p + local_190._M_string_length);
    paVar1 = &local_1b0.field_2;
    uVar9 = 0;
    do {
      local_148._prim_part.field_2._M_local_buf[2] = '/';
      local_148._prim_part.field_2._M_allocated_capacity._0_2_ = 0x2e2e;
      local_148._prim_part._M_string_length = 3;
      local_148._prim_part.field_2._M_local_buf[3] = '\0';
      if ((local_1d0._M_string_length < 3) ||
         ((char)*(short *)(local_1d0._M_dataplus._M_p + 2) != '/' ||
          *(short *)local_1d0._M_dataplus._M_p != 0x2e2e)) break;
      local_1b0.field_2._M_local_buf[2] = '/';
      local_1b0.field_2._M_allocated_capacity._0_2_ = 0x2e2e;
      local_1b0._M_string_length = 3;
      local_1b0.field_2._M_local_buf[3] = '\0';
      if ((local_1d0._M_string_length < 3) ||
         ((char)*(short *)(local_1d0._M_dataplus._M_p + 2) != '/' ||
          *(short *)local_1d0._M_dataplus._M_p != 0x2e2e)) {
        local_1b0._M_dataplus._M_p = (pointer)paVar1;
        local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_1d0._M_dataplus._M_p,
                   local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
      }
      else {
        local_1b0._M_dataplus._M_p = (pointer)paVar1;
        local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_1d0);
      }
      ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0._M_dataplus._M_p,
                        CONCAT44(local_1b0.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_1b0.field_2._M_local_buf[3],
                                          CONCAT12(local_1b0.field_2._M_local_buf[2],
                                                   local_1b0.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < 0x100000 || local_1d0._M_string_length != 0);
    local_148._prim_part._M_dataplus._M_p = (pointer)&local_148._prim_part.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,".","");
    lVar5 = ::std::__cxx11::string::find
                      ((char *)&local_1d0,(ulong)local_148._prim_part._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                        CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                 local_148._prim_part.field_2._M_allocated_capacity.
                                                 _0_2_))) + 1);
    }
    if (lVar5 != -1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
LAB_001ee378:
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001ee90c;
    }
    local_1b0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar5 = 0x147ae15;
    uVar6 = 0;
    do {
      uVar6 = ::std::__cxx11::string::find_first_not_of
                        ((char *)&local_78,(ulong)local_1b0._M_dataplus._M_p,uVar6);
      if (uVar6 == 0xffffffffffffffff) break;
      uVar6 = ::std::__cxx11::string::find
                        ((char *)&local_78,(ulong)local_1b0._M_dataplus._M_p,uVar6);
      ::std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_78);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,
                      CONCAT44(local_1b0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_1b0.field_2._M_local_buf[3],
                                        CONCAT12(local_1b0.field_2._M_local_buf[2],
                                                 local_1b0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    abs_path = local_150;
    paVar2 = &local_148._prim_part.field_2;
    if ((long)local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      ::std::operator+(&local_148._prim_part,"/",&local_1d0);
      ::std::__cxx11::string::operator=((string *)&local_170,(string *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
    }
    else {
      lVar5 = ((long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - uVar9;
      if (lVar5 < -1) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::append((char *)err);
        }
      }
      else if (lVar5 < 1) {
        ::std::operator+(&local_148._prim_part,"/",&local_1d0);
        ::std::__cxx11::string::_M_append
                  ((char *)&local_170,(ulong)local_148._prim_part._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._prim_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_148._prim_part._M_dataplus._M_p,
                          CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                            CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                     local_148._prim_part.field_2.
                                                     _M_allocated_capacity._0_2_))) + 1);
        }
      }
      else {
        lVar10 = 0;
        lVar7 = lVar5;
        do {
          ::std::operator+(&local_148._prim_part,"/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((local_58.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar10));
          ::std::__cxx11::string::_M_append
                    ((char *)&local_170,(ulong)local_148._prim_part._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
            operator_delete(local_148._prim_part._M_dataplus._M_p,
                            CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                     CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                              CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                       local_148._prim_part.field_2.
                                                       _M_allocated_capacity._0_2_))) + 1);
          }
          lVar10 = lVar10 + 0x20;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        ::std::operator+(&local_148._prim_part,"/",&local_1d0);
        ::std::__cxx11::string::_M_append
                  ((char *)&local_170,(ulong)local_148._prim_part._M_dataplus._M_p);
        abs_path = local_150;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
          operator_delete(local_148._prim_part._M_dataplus._M_p,
                          CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                            CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                     local_148._prim_part.field_2.
                                                     _M_allocated_capacity._0_2_))) + 1);
          abs_path = local_150;
        }
      }
      if (lVar5 < -1) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001ee378;
        goto LAB_001ee90c;
      }
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    _Var8._M_p = local_1d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
LAB_001ee7ef:
      operator_delete(_Var8._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
LAB_001ee7f7:
    Path::Path(&local_148,&local_170,(string *)&local_38->_prop_part);
    Path::operator=(abs_path,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._element._M_dataplus._M_p != &local_148._element.field_2) {
      operator_delete(local_148._element._M_dataplus._M_p,
                      local_148._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part_str._M_dataplus._M_p != &local_148._variant_part_str.field_2) {
      operator_delete(local_148._variant_part_str._M_dataplus._M_p,
                      local_148._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_selection_part._M_dataplus._M_p !=
        &local_148._variant_selection_part.field_2) {
      operator_delete(local_148._variant_selection_part._M_dataplus._M_p,
                      local_148._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part._M_dataplus._M_p != &local_148._variant_part.field_2) {
      operator_delete(local_148._variant_part._M_dataplus._M_p,
                      local_148._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prop_part._M_dataplus._M_p != &local_148._prop_part.field_2) {
      operator_delete(local_148._prop_part._M_dataplus._M_p,
                      local_148._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                        CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                 local_148._prim_part.field_2._M_allocated_capacity.
                                                 _0_2_))) + 1);
    }
    bVar11 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
LAB_001ee925:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool ResolveRelativePath(const Path &base_prim_path, const Path &relative_path, Path *abs_path, std::string *err) {

  if (!abs_path) {
    return false;
  }

  std::string relative_str = relative_path.prim_part();
  std::string base_str = base_prim_path.prim_part();

  // base_prim_path must be absolute.
  if (startsWith(base_str, "/")) {
    // ok
  } else {
    if (err) {
      (*err) += "Base Prim path is not absolute path.\n";
    }
    return false;
  }

  std::string abs_dir;

  if (startsWith(relative_str, "./")) {
    // pxrUSD doesn't allow "./", so do same in tinyusdz.
#if 1
    if (err) {
      (*err) += "Path starting with `./` is not allowed.\n";
    }
    return false;
#else
    std::string remainder = removePrefix(relative_str, "./");

    // "./../", "././", etc is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      return false;
    }

    abs_dir = base_str + "/" + remainder;
#endif

  } else if (startsWith(relative_str, "../")) {
    // ok
    size_t ndepth{0};
    std::string remainder = RemoveRelativePrefix(relative_str, ndepth);
    DCOUT("remainder = " << remainder << ", ndepth = " << ndepth);

    // "../" in subsequent position(e.g. `../bora/../dora`) is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      if (err) {
        (*err) += "`../` in the middle of Path is not allowed.\n";
      }
      return false;
    }

    std::vector<std::string> base_dirs = split(base_str, "/");
    DCOUT("base_dirs.len = " << base_dirs.size());
    //if (base_dirs.size() < ndepth) {
    //  return false;
    //}

    if (base_dirs.size() == 0) { // "/"
      abs_dir = "/" + remainder;
    } else {
      int64_t n = int64_t(base_dirs.size()) - int64_t(ndepth);

#if 1
      // pxrUSD behavior
      if (n < -1) {
        if (err) {
          (*err) += "The number of `../` exceeds Prim path depth.\n";
        }
        return false;
      }
#else
      // Unixish path behavior
#endif
      if (n <= 0) {
        abs_dir += "/" + remainder;
      } else {
        for (size_t i = 0; i < size_t(n); i++) {
          abs_dir += "/" + base_dirs[i];
        }
        abs_dir += "/" + remainder;
      }
    }
  } else if (startsWith(relative_str, ".")) {
    // Property path?
    if (err) {
      (*err) += "A path starting with `.` is not allowed for Prim path.\n";
    }
    return false;
  } else if (startsWith(relative_str, "/")) {
    // Input path is already absolute.
    abs_dir = relative_str;
  } else {
    // Guess relative path(e.g. "muda", "bora/dora")
    // TODO: Check Path contains valid characters.
    abs_dir = base_str + "/" + relative_str;
  }

  (*abs_path) = Path(abs_dir, relative_path.prop_part());

  return true;
}